

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

int32_t utrie_serialize_63(UNewTrie *trie,void *dt,int32_t capacity,
                          UNewTrieGetFoldedValue *getFoldedValue,UBool reduceTo16Bits,
                          UErrorCode *pErrorCode)

{
  UBool UVar1;
  int iVar2;
  int local_6c;
  uint8_t *data;
  int32_t length;
  int32_t i;
  uint16_t *dest16;
  uint32_t *p;
  UTrieHeader *header;
  UErrorCode *pErrorCode_local;
  code *pcStack_30;
  UBool reduceTo16Bits_local;
  UNewTrieGetFoldedValue *getFoldedValue_local;
  int32_t capacity_local;
  void *dt_local;
  UNewTrie *trie_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    trie_local._4_4_ = 0;
  }
  else if (((trie == (UNewTrie *)0x0) || (capacity < 0)) || ((0 < capacity && (dt == (void *)0x0))))
  {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    trie_local._4_4_ = 0;
  }
  else {
    pcStack_30 = getFoldedValue;
    if (getFoldedValue == (UNewTrieGetFoldedValue *)0x0) {
      pcStack_30 = defaultGetFoldedValue;
    }
    if (trie->isCompacted == '\0') {
      utrie_compact(trie,'\0',pErrorCode);
      utrie_fold(trie,pcStack_30,pErrorCode);
      utrie_compact(trie,'\x01',pErrorCode);
      trie->isCompacted = '\x01';
      UVar1 = U_FAILURE(*pErrorCode);
      if (UVar1 != '\0') {
        return 0;
      }
    }
    if (reduceTo16Bits == '\0') {
      local_6c = trie->dataLength;
    }
    else {
      local_6c = trie->dataLength + trie->indexLength;
    }
    if (0x3ffff < local_6c) {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    if (reduceTo16Bits == '\0') {
      iVar2 = trie->dataLength * 4;
    }
    else {
      iVar2 = trie->dataLength * 2;
    }
    data._0_4_ = iVar2 + trie->indexLength * 2 + 0x10;
    if (capacity < (int)data) {
      trie_local._4_4_ = (int)data;
    }
    else {
      *(undefined4 *)dt = 0x54726965;
      *(undefined4 *)((long)dt + 4) = 0x25;
      if (reduceTo16Bits == '\0') {
        *(uint *)((long)dt + 4) = *(uint *)((long)dt + 4) | 0x100;
      }
      if (trie->isLatin1Linear != '\0') {
        *(uint *)((long)dt + 4) = *(uint *)((long)dt + 4) | 0x200;
      }
      *(int32_t *)((long)dt + 8) = trie->indexLength;
      *(int32_t *)((long)dt + 0xc) = trie->dataLength;
      _length = (undefined2 *)((long)dt + 0x10);
      if (reduceTo16Bits == '\0') {
        dest16 = (uint16_t *)trie;
        for (data._4_4_ = trie->indexLength; 0 < data._4_4_; data._4_4_ = data._4_4_ + -1) {
          *_length = (short)(*(uint *)dest16 >> 2);
          _length = _length + 1;
          dest16 = dest16 + 2;
        }
        memcpy(_length,trie->data,(long)trie->dataLength << 2);
      }
      else {
        dest16 = (uint16_t *)trie;
        for (data._4_4_ = trie->indexLength; 0 < data._4_4_; data._4_4_ = data._4_4_ + -1) {
          *_length = (short)((uint)(*(int *)dest16 + trie->indexLength) >> 2);
          _length = _length + 1;
          dest16 = dest16 + 2;
        }
        dest16 = (uint16_t *)trie->data;
        for (data._4_4_ = trie->dataLength; 0 < data._4_4_; data._4_4_ = data._4_4_ + -1) {
          *_length = (short)*(undefined4 *)dest16;
          _length = _length + 1;
          dest16 = dest16 + 2;
        }
      }
      trie_local._4_4_ = (int)data;
    }
  }
  return trie_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_serialize(UNewTrie *trie, void *dt, int32_t capacity,
                UNewTrieGetFoldedValue *getFoldedValue,
                UBool reduceTo16Bits,
                UErrorCode *pErrorCode) {
    UTrieHeader *header;
    uint32_t *p;
    uint16_t *dest16;
    int32_t i, length;
    uint8_t* data = NULL;

    /* argument check */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(trie==NULL || capacity<0 || (capacity>0 && dt==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(getFoldedValue==NULL) {
        getFoldedValue=defaultGetFoldedValue;
    }

    data = (uint8_t*)dt;
    /* fold and compact if necessary, also checks that indexLength is within limits */
    if(!trie->isCompacted) {
        /* compact once without overlap to improve folding */
        utrie_compact(trie, FALSE, pErrorCode);

        /* fold the supplementary part of the index array */
        utrie_fold(trie, getFoldedValue, pErrorCode);

        /* compact again with overlap for minimum data array length */
        utrie_compact(trie, TRUE, pErrorCode);

        trie->isCompacted=TRUE;
        if(U_FAILURE(*pErrorCode)) {
            return 0;
        }
    }

    /* is dataLength within limits? */
    if( (reduceTo16Bits ? (trie->dataLength+trie->indexLength) : trie->dataLength) >= UTRIE_MAX_DATA_LENGTH) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
    }

    length=sizeof(UTrieHeader)+2*trie->indexLength;
    if(reduceTo16Bits) {
        length+=2*trie->dataLength;
    } else {
        length+=4*trie->dataLength;
    }

    if(length>capacity) {
        return length; /* preflighting */
    }

#ifdef UTRIE_DEBUG
    printf("**UTrieLengths(serialize)** index:%6ld  data:%6ld  serialized:%6ld\n",
           (long)trie->indexLength, (long)trie->dataLength, (long)length);
#endif

    /* set the header fields */
    header=(UTrieHeader *)data;
    data+=sizeof(UTrieHeader);

    header->signature=0x54726965; /* "Trie" */
    header->options=UTRIE_SHIFT | (UTRIE_INDEX_SHIFT<<UTRIE_OPTIONS_INDEX_SHIFT);

    if(!reduceTo16Bits) {
        header->options|=UTRIE_OPTIONS_DATA_IS_32_BIT;
    }
    if(trie->isLatin1Linear) {
        header->options|=UTRIE_OPTIONS_LATIN1_IS_LINEAR;
    }

    header->indexLength=trie->indexLength;
    header->dataLength=trie->dataLength;

    /* write the index (stage 1) array and the 16/32-bit data (stage 2) array */
    if(reduceTo16Bits) {
        /* write 16-bit index values shifted right by UTRIE_INDEX_SHIFT, after adding indexLength */
        p=(uint32_t *)trie->index;
        dest16=(uint16_t *)data;
        for(i=trie->indexLength; i>0; --i) {
            *dest16++=(uint16_t)((*p++ + trie->indexLength)>>UTRIE_INDEX_SHIFT);
        }

        /* write 16-bit data values */
        p=trie->data;
        for(i=trie->dataLength; i>0; --i) {
            *dest16++=(uint16_t)*p++;
        }
    } else {
        /* write 16-bit index values shifted right by UTRIE_INDEX_SHIFT */
        p=(uint32_t *)trie->index;
        dest16=(uint16_t *)data;
        for(i=trie->indexLength; i>0; --i) {
            *dest16++=(uint16_t)(*p++ >> UTRIE_INDEX_SHIFT);
        }

        /* write 32-bit data values */
        uprv_memcpy(dest16, trie->data, 4*(size_t)trie->dataLength);
    }

    return length;
}